

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStructBody
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  StructDef *struct_def_00;
  Type type;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  undefined6 uVar4;
  char *pcVar5;
  bool bVar6;
  reference ppFVar7;
  char *pcVar8;
  Type *type_00;
  undefined8 in_stack_fffffffffffffc38;
  allocator<char> local_309;
  string local_308;
  undefined8 local_2e8;
  StructDef *pSStack_2e0;
  EnumDef *local_2d8;
  undefined8 uStack_2d0;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  string local_188;
  string local_168;
  allocator<char> local_141;
  string local_140;
  FieldDef *local_120;
  FieldDef *field;
  undefined1 local_110 [8];
  reverse_iterator it;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *nameprefix_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  local_28 = nameprefix;
  nameprefix_local = (char *)writer;
  writer_local = (CodeWriter *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"align",&local_49);
  NumToString<unsigned_long>(&local_80,*(unsigned_long *)&writer_local->field_0x118);
  CodeWriter::SetValue(writer,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar8 = nameprefix_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"size",&local_a1);
  NumToString<unsigned_long>(&local_c8,*(unsigned_long *)&writer_local->field_0x120);
  CodeWriter::SetValue((CodeWriter *)pcVar8,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"builder.prep({{align}}, {{size}})",
             (allocator<char> *)
             ((long)&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it,
             (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
             &writer_local->field_0xf8);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_110)
  ;
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar6 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_110,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar6) break;
    ppFVar7 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_110);
    pcVar8 = nameprefix_local;
    local_120 = *ppFVar7;
    if (local_120->padding != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"pad",&local_141);
      NumToString<unsigned_long>(&local_168,local_120->padding);
      CodeWriter::SetValue((CodeWriter *)pcVar8,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"builder.pad({{pad}})",&local_189);
      CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    bVar6 = IsStruct(&(local_120->value).type);
    pcVar5 = nameprefix_local;
    pcVar8 = local_28;
    if (bVar6) {
      struct_def_00 = (local_120->value).type.struct_def;
      std::operator+(&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "_");
      std::operator+(&local_1b0,pcVar8,&local_1d0);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      GenStructBody(this,struct_def_00,(CodeWriter *)pcVar5,pcVar8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"type",&local_1f1);
      GenMethod_abi_cxx11_(&local_218,(KotlinGenerator *)&local_120->value,type_00);
      CodeWriter::SetValue((CodeWriter *)pcVar5,&local_1f0,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      pcVar5 = nameprefix_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"argname",&local_239);
      pcVar8 = local_28;
      IdlNamer::Variable_abi_cxx11_(&local_280,&this->namer_,local_120);
      std::operator+(&local_260,pcVar8,&local_280);
      CodeWriter::SetValue((CodeWriter *)pcVar5,&local_238,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      pcVar8 = nameprefix_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"cast",&local_2a1);
      local_2e8._0_4_ = (local_120->value).type.base_type;
      local_2e8._4_4_ = (local_120->value).type.element;
      pSStack_2e0 = (local_120->value).type.struct_def;
      local_2d8 = (local_120->value).type.enum_def;
      uStack_2d0 = *(undefined8 *)&(local_120->value).type.fixed_length;
      uVar1 = (local_120->value).type.struct_def;
      uVar2 = (local_120->value).type.enum_def;
      uVar3 = (local_120->value).type.fixed_length;
      uVar4 = *(undefined6 *)&(local_120->value).type.field_0x1a;
      type.enum_def._2_6_ = uVar4;
      type.enum_def._0_2_ = uVar3;
      type.struct_def = (StructDef *)uVar2;
      type._0_8_ = uVar1;
      type._24_8_ = in_stack_fffffffffffffc38;
      CastToSigned_abi_cxx11_(type);
      CodeWriter::SetValue((CodeWriter *)pcVar8,&local_2a0,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"builder.put{{type}}({{argname}}{{cast}})",&local_309);
      CodeWriter::operator+=((CodeWriter *)nameprefix_local,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_110);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it);
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname", nameprefix + namer_.Variable(field));
        writer.SetValue("cast", CastToSigned(field.value.type));
        writer += "builder.put{{type}}({{argname}}{{cast}})";
      }
    }
  }